

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_123::AggregateConnectionReceiver::setsockopt
          (AggregateConnectionReceiver *this,int __fd,int __level,int __optname,void *__optval,
          socklen_t __optlen)

{
  int in_EAX;
  undefined4 in_register_0000000c;
  Own<kj::ConnectionReceiver,_std::nullptr_t> *r;
  Own<kj::ConnectionReceiver,_std::nullptr_t> *pOVar1;
  long lVar2;
  
  pOVar1 = (this->receivers).ptr;
  for (lVar2 = (this->receivers).size_ << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    in_EAX = (*pOVar1->ptr->_vptr_ConnectionReceiver[4])
                       (pOVar1->ptr,(ulong)(uint)__fd,(ulong)(uint)__level,
                        CONCAT44(in_register_0000000c,__optname),(ulong)__optval & 0xffffffff);
    pOVar1 = pOVar1 + 1;
  }
  return in_EAX;
}

Assistant:

void setsockopt(int level, int option, const void* value, uint length) override {
    // Apply to all.
    for (auto& r: receivers) {
      r->setsockopt(level, option, value, length);
    }
  }